

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_monitor.c
# Opt level: O2

GLFWvidmode *
vidmodeFromModeInfo(GLFWvidmode *__return_storage_ptr__,XRRModeInfo *mi,XRRCrtcInfo *ci)

{
  uint *puVar1;
  int iVar2;
  double dVar3;
  long lStack_20;
  
  if ((ci->rotation == 8) || (ci->rotation == 2)) {
    puVar1 = &mi->height;
    lStack_20 = 8;
  }
  else {
    puVar1 = &mi->width;
    lStack_20 = 0xc;
  }
  __return_storage_ptr__->width = *puVar1;
  __return_storage_ptr__->height = *(int *)((long)&mi->id + lStack_20);
  iVar2 = 0;
  if ((mi->hTotal != 0) && (iVar2 = 0, mi->vTotal != 0)) {
    dVar3 = round((((double)CONCAT44(0x45300000,(int)(mi->dotClock >> 0x20)) -
                   1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)mi->dotClock) - 4503599627370496.0)) /
                  ((double)mi->vTotal * (double)mi->hTotal));
    iVar2 = (int)dVar3;
  }
  __return_storage_ptr__->refreshRate = iVar2;
  _glfwSplitBPP(*(int *)(*(long *)(_glfw.x11.display + 0xe8) + 0x38 + (long)_glfw.x11.screen * 0x80)
                ,&__return_storage_ptr__->redBits,&__return_storage_ptr__->greenBits,
                &__return_storage_ptr__->blueBits);
  return __return_storage_ptr__;
}

Assistant:

static GLFWvidmode vidmodeFromModeInfo(const XRRModeInfo* mi,
                                       const XRRCrtcInfo* ci)
{
    GLFWvidmode mode;

    if (ci->rotation == RR_Rotate_90 || ci->rotation == RR_Rotate_270)
    {
        mode.width  = mi->height;
        mode.height = mi->width;
    }
    else
    {
        mode.width  = mi->width;
        mode.height = mi->height;
    }

    mode.refreshRate = calculateRefreshRate(mi);

    _glfwSplitBPP(DefaultDepth(_glfw.x11.display, _glfw.x11.screen),
                  &mode.redBits, &mode.greenBits, &mode.blueBits);

    return mode;
}